

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O0

ImageDataFunctionHeader * lrit::getHeader<lrit::ImageDataFunctionHeader>(Buffer *b,int pos)

{
  size_t in_RCX;
  HeaderReader<lrit::ImageDataFunctionHeader> *in_RDI;
  HeaderReader<lrit::ImageDataFunctionHeader> r;
  ImageDataFunctionHeader *h;
  HeaderReader<lrit::ImageDataFunctionHeader> *pHVar1;
  HeaderReader<lrit::ImageDataFunctionHeader> *this;
  HeaderReader<lrit::ImageDataFunctionHeader> local_48;
  
  this = &local_48;
  pHVar1 = in_RDI;
  HeaderReader<lrit::ImageDataFunctionHeader>::HeaderReader(in_RDI,(Buffer *)in_RDI,0);
  HeaderReader<lrit::ImageDataFunctionHeader>::getHeader(this);
  HeaderReader<lrit::ImageDataFunctionHeader>::read
            (&local_48,(int)pHVar1 + 8,(void *)(long)(int)(*(ushort *)((long)&pHVar1->b_ + 2) - 3),
             in_RCX);
  HeaderReader<lrit::ImageDataFunctionHeader>::~HeaderReader
            ((HeaderReader<lrit::ImageDataFunctionHeader> *)0x12158a);
  return (ImageDataFunctionHeader *)in_RDI;
}

Assistant:

ImageDataFunctionHeader getHeader(const Buffer& b, int pos) {
  auto r = HeaderReader<ImageDataFunctionHeader>(b, pos);
  auto h = r.getHeader();
  r.read(h.data, h.headerLength - 3);
  return h;
}